

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t intersect_vector16_cardinality(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  uint16_t b;
  uint16_t a;
  uint16_t b_max_1;
  uint16_t a_max_1;
  int r_1;
  __m128i res_v_1;
  uint16_t b_max;
  uint16_t a_max;
  int r;
  __m128i res_v;
  __m128i v_b;
  __m128i v_a;
  size_t st_b;
  size_t st_a;
  ulong uStack_78;
  int vectorlength;
  size_t i_b;
  size_t i_a;
  size_t count;
  size_t s_b_local;
  uint16_t *B_local;
  size_t s_a_local;
  uint16_t *A_local;
  
  i_a = 0;
  i_b = 0;
  uStack_78 = 0;
  uVar1 = s_a & 0xfffffffffffffff8;
  uVar2 = s_b & 0xfffffffffffffff8;
  if ((uVar1 != 0) && (uVar2 != 0)) {
    unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])A);
    unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])B);
LAB_00101c5d:
    bVar4 = true;
    if (A[i_b] != 0) {
      bVar4 = B[uStack_78] == 0;
    }
    if (!bVar4) goto LAB_00101dbe;
    vpcmpestrm_avx(stack0xffffffffffffff48,stack0xffffffffffffff58,1);
    _b_max = (undefined4)res_v[1];
    i_a = (long)POPCOUNT(_b_max) + i_a;
    lVar3 = i_b + 7;
    if (A[lVar3] <= B[uStack_78 + 7]) {
      i_b = i_b + 8;
      if (i_b == uVar1) goto LAB_00101dbe;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(A + i_b));
    }
    if (B[uStack_78 + 7] <= A[lVar3]) {
      uStack_78 = uStack_78 + 8;
      if (uStack_78 == uVar2) goto LAB_00101dbe;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(B + uStack_78));
    }
    goto LAB_00101c5d;
  }
  goto LAB_00101eff;
LAB_00101dbe:
  if ((i_b < uVar1) && (uStack_78 < uVar2)) {
LAB_00101ddf:
    vpcmpistrm_avx(stack0xffffffffffffff48,stack0xffffffffffffff58,1);
    _b_max_1 = (undefined4)res_v[1];
    i_a = (long)POPCOUNT(_b_max_1) + i_a;
    lVar3 = i_b + 7;
    if (A[lVar3] <= B[uStack_78 + 7]) {
      i_b = i_b + 8;
      if (i_b == uVar1) goto LAB_00101eff;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(A + i_b));
    }
    if (B[uStack_78 + 7] <= A[lVar3]) {
      uStack_78 = uStack_78 + 8;
      if (uStack_78 == uVar2) goto LAB_00101eff;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(B + uStack_78));
    }
    goto LAB_00101ddf;
  }
LAB_00101eff:
  while (i_b < s_a && uStack_78 < s_b) {
    if (A[i_b] < B[uStack_78]) {
      i_b = i_b + 1;
    }
    else {
      if (A[i_b] <= B[uStack_78]) {
        i_a = i_a + 1;
        i_b = i_b + 1;
      }
      uStack_78 = uStack_78 + 1;
    }
  }
  return (int32_t)i_a;
}

Assistant:

int32_t intersect_vector16_cardinality(const uint16_t *__restrict__ A,
                                       size_t s_a,
                                       const uint16_t *__restrict__ B,
                                       size_t s_b) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b))
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}